

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::SymbolTable::EnsureUnique(SymbolTable *this,string_view *name)

{
  size_type sVar1;
  
  sVar1 = std::
          set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>::
          count(&this->seen_names_,name);
  if (sVar1 != 0) {
    fprintf(_stderr,"error: duplicate symbol when writing relocatable binary: %s\n",name->data_);
  }
  else {
    std::
    _Rb_tree<wabt::string_view,wabt::string_view,std::_Identity<wabt::string_view>,std::less<wabt::string_view>,std::allocator<wabt::string_view>>
    ::_M_insert_unique<wabt::string_view_const&>
              ((_Rb_tree<wabt::string_view,wabt::string_view,std::_Identity<wabt::string_view>,std::less<wabt::string_view>,std::allocator<wabt::string_view>>
                *)&this->seen_names_,name);
  }
  return (Result)(uint)(sVar1 != 0);
}

Assistant:

Result EnsureUnique(const string_view& name) {
    if (seen_names_.count(name)) {
      fprintf(stderr, "error: duplicate symbol when writing relocatable "
              "binary: %s\n", &name[0]);
      return Result::Error;
    }
    seen_names_.insert(name);
    return Result::Ok;
  }